

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,RegexFlags *flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  RegexFlags RVar5;
  code *pcVar6;
  uint uVar7;
  bool bVar8;
  undefined4 *puVar9;
  uint uVar10;
  long lVar11;
  RegexFlags RVar12;
  RegexFlags RVar13;
  CharCount i;
  ulong uVar14;
  long lVar15;
  
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar8) goto LAB_00ef0eb7;
      *puVar9 = 0;
    }
    pbVar4 = this->next;
    bVar1 = *pbVar4;
    uVar14 = (ulong)bVar1;
    if (bVar1 == 0x5c) {
      if (this->inputLim < pbVar4 + 6) goto LAB_00ef0aff;
      if (this->inputLim < pbVar4 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      if (this->next[1] != 'u') goto LAB_00ef0aff;
      if (this->inputLim < this->next + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      if ((ASCIIChars::classes[this->next[2]] & 0x40) == 0) goto LAB_00ef0aff;
      if (this->inputLim < this->next + 3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      if ((ASCIIChars::classes[this->next[3]] & 0x40) == 0) goto LAB_00ef0aff;
      if (this->inputLim < this->next + 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      if ((ASCIIChars::classes[this->next[4]] & 0x40) == 0) goto LAB_00ef0aff;
      if (this->inputLim < this->next + 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      if ((ASCIIChars::classes[this->next[5]] & 0x40) == 0) goto LAB_00ef0aff;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != false) goto LAB_00ef0e9c;
      if (this->inputLim < this->next + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) {
LAB_00ef0eb7:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar9 = 0;
      }
      bVar1 = ASCIIChars::values[this->next[2]];
      if (this->inputLim < this->next + 3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      bVar2 = ASCIIChars::values[this->next[3]];
      if (this->inputLim < this->next + 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      bVar3 = ASCIIChars::values[this->next[4]];
      if (this->inputLim < this->next + 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      uVar14 = (ulong)((uint)bVar3 << 4 | (uint)bVar2 << 8 | (uint)bVar1 << 0xc |
                      (uint)(byte)ASCIIChars::values[this->next[5]]);
      lVar11 = 6;
      if (0xf < bVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
    }
    else {
      if (bVar1 == 0) {
        return;
      }
LAB_00ef0aff:
      lVar11 = 1;
    }
    uVar7 = (uint)(uVar14 & 0xffff);
    uVar10 = uVar7 - 0x67;
    switch(uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) {
    case 0:
      RVar12 = GlobalRegexFlag;
      RVar13 = GlobalRegexFlag;
      RVar5 = *flags & GlobalRegexFlag;
      break;
    case 1:
      RVar12 = IgnoreCaseRegexFlag;
      RVar13 = IgnoreCaseRegexFlag;
      RVar5 = *flags & IgnoreCaseRegexFlag;
      break;
    default:
switchD_00ef0b25_caseD_2:
      if ((0xff < uVar7) || ((ASCIIChars::classes[uVar14 & 0xffff] & 1) == 0)) {
        return;
      }
LAB_00ef0e9c:
      Fail(this,-0x7ff5ec67);
      return;
    case 3:
      RVar12 = MultilineRegexFlag;
      RVar13 = MultilineRegexFlag;
      RVar5 = *flags & MultilineRegexFlag;
      break;
    case 6:
      if (((this->scriptContext->config).threadConfig)->m_ES2018RegExDotAll != true)
      goto switchD_00ef0b25_caseD_7;
      RVar12 = DotAllRegexFlag;
      RVar13 = DotAllRegexFlag;
      RVar5 = *flags & DotAllRegexFlag;
      break;
    case 7:
switchD_00ef0b25_caseD_7:
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != true)
      goto switchD_00ef0b25_caseD_9;
      RVar12 = UnicodeRegexFlag;
      RVar13 = UnicodeRegexFlag;
      RVar5 = *flags & UnicodeRegexFlag;
      break;
    case 9:
switchD_00ef0b25_caseD_9:
      if (((this->scriptContext->config).threadConfig)->m_ES6RegExSticky != true)
      goto switchD_00ef0b25_caseD_2;
      RVar12 = StickyRegexFlag;
      RVar13 = StickyRegexFlag;
      RVar5 = *flags & StickyRegexFlag;
    }
    if (RVar5 != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar13 = RVar12;
    }
    *flags = *flags | RVar13;
    if (this->inputLim < this->next + lVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar8) goto LAB_00ef0eb7;
      *puVar9 = 0;
    }
    lVar15 = 0;
    do {
      if ((char)this->next[lVar15] < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar8) goto LAB_00ef0eb7;
        *puVar9 = 0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar11 != lVar15);
    this->next = this->next + lVar11;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }